

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode readIsAbstractAttribute(UA_Node *node,UA_Variant *v)

{
  long lVar1;
  uint uVar2;
  UA_StatusCode UVar3;
  uint uVar4;
  
  uVar2 = node->nodeClass - UA_NODECLASS_OBJECTTYPE >> 3;
  uVar4 = node->nodeClass << 0x1d | uVar2;
  UVar3 = 0x80350000;
  if ((uVar4 < 8) && ((0x8bU >> (uVar2 & 0x1f) & 1) != 0)) {
    lVar1 = *(long *)(&DAT_0012d8b8 + (ulong)uVar4 * 8);
    v->data = (void *)0x0;
    v->arrayDimensionsSize = 0;
    *(undefined8 *)&v->storageType = 0;
    v->arrayLength = 0;
    v->arrayDimensions = (UA_UInt32 *)0x0;
    v->type = UA_TYPES;
    v->data = (void *)((long)&(node->nodeId).namespaceIndex + lVar1);
    v->storageType = UA_VARIANT_DATA_NODELETE;
    UVar3 = 0;
  }
  return UVar3;
}

Assistant:

static UA_StatusCode
readIsAbstractAttribute(const UA_Node *node, UA_Variant *v) {
    const UA_Boolean *isAbstract;
    switch(node->nodeClass) {
    case UA_NODECLASS_REFERENCETYPE:
        isAbstract = &((const UA_ReferenceTypeNode*)node)->isAbstract;
        break;
    case UA_NODECLASS_OBJECTTYPE:
        isAbstract = &((const UA_ObjectTypeNode*)node)->isAbstract;
        break;
    case UA_NODECLASS_VARIABLETYPE:
        isAbstract = &((const UA_VariableTypeNode*)node)->isAbstract;
        break;
    case UA_NODECLASS_DATATYPE:
        isAbstract = &((const UA_DataTypeNode*)node)->isAbstract;
        break;
    default:
        return UA_STATUSCODE_BADATTRIBUTEIDINVALID;
    }
    forceVariantSetScalar(v, isAbstract, &UA_TYPES[UA_TYPES_BOOLEAN]);
    return UA_STATUSCODE_GOOD;
}